

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtGImpactQuantizedBvh.cpp
# Opt level: O3

void __thiscall
cbtQuantizedBvhTree::build_tree(cbtQuantizedBvhTree *this,GIM_BVH_DATA_ARRAY *primitive_boxes)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  BT_QUANTIZED_BVH_NODE *ptr;
  undefined8 uVar3;
  undefined8 uVar4;
  uint uVar5;
  BT_QUANTIZED_BVH_NODE *pBVar6;
  int *piVar7;
  int endIndex;
  long lVar8;
  ulong uVar9;
  int iVar10;
  long lVar11;
  undefined1 auVar12 [64];
  undefined1 auVar13 [64];
  undefined1 auVar14 [64];
  undefined1 auVar15 [64];
  undefined1 auVar16 [64];
  undefined1 auVar17 [64];
  undefined1 auVar18 [64];
  undefined1 auVar19 [64];
  undefined1 auVar20 [64];
  
  calc_quantization(this,primitive_boxes,1.0);
  this->m_num_nodes = 0;
  endIndex = (primitive_boxes->super_cbtAlignedObjectArray<GIM_BVH_DATA>).m_size;
  uVar5 = (this->m_node_array).super_cbtAlignedObjectArray<BT_QUANTIZED_BVH_NODE>.m_size;
  iVar10 = endIndex * 2;
  if ((int)uVar5 < iVar10) {
    lVar11 = (long)(int)uVar5;
    if ((this->m_node_array).super_cbtAlignedObjectArray<BT_QUANTIZED_BVH_NODE>.m_capacity < iVar10)
    {
      if (endIndex == 0) {
        pBVar6 = (BT_QUANTIZED_BVH_NODE *)0x0;
      }
      else {
        pBVar6 = (BT_QUANTIZED_BVH_NODE *)cbtAlignedAllocInternal((long)endIndex << 5,0x10);
        uVar5 = (this->m_node_array).super_cbtAlignedObjectArray<BT_QUANTIZED_BVH_NODE>.m_size;
      }
      if (0 < (int)uVar5) {
        lVar8 = 0;
        do {
          puVar1 = (undefined8 *)
                   ((long)((this->m_node_array).super_cbtAlignedObjectArray<BT_QUANTIZED_BVH_NODE>.
                          m_data)->m_quantizedAabbMin + lVar8);
          uVar3 = puVar1[1];
          puVar2 = (undefined8 *)((long)pBVar6->m_quantizedAabbMin + lVar8);
          *puVar2 = *puVar1;
          puVar2[1] = uVar3;
          lVar8 = lVar8 + 0x10;
        } while ((ulong)uVar5 << 4 != lVar8);
      }
      ptr = (this->m_node_array).super_cbtAlignedObjectArray<BT_QUANTIZED_BVH_NODE>.m_data;
      if ((ptr != (BT_QUANTIZED_BVH_NODE *)0x0) &&
         ((this->m_node_array).super_cbtAlignedObjectArray<BT_QUANTIZED_BVH_NODE>.m_ownsMemory ==
          true)) {
        cbtAlignedFreeInternal(ptr);
      }
      (this->m_node_array).super_cbtAlignedObjectArray<BT_QUANTIZED_BVH_NODE>.m_ownsMemory = true;
      (this->m_node_array).super_cbtAlignedObjectArray<BT_QUANTIZED_BVH_NODE>.m_data = pBVar6;
      (this->m_node_array).super_cbtAlignedObjectArray<BT_QUANTIZED_BVH_NODE>.m_capacity = iVar10;
    }
    auVar12 = vpbroadcastq_avx512f();
    auVar13 = vpaddq_avx512f(auVar12,_DAT_009f0f40);
    auVar12 = vpaddq_avx512f(auVar12,_DAT_009f0f80);
    auVar14 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
    auVar15 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
    auVar16 = vpbroadcastq_avx512f(ZEXT816(0x10));
    auVar17 = vpbroadcastq_avx512f();
    uVar9 = 0;
    piVar7 = &((this->m_node_array).super_cbtAlignedObjectArray<BT_QUANTIZED_BVH_NODE>.m_data)->
              m_escapeIndexOrDataIndex;
    do {
      auVar18 = vpbroadcastq_avx512f();
      auVar19 = vpsllq_avx512f(auVar12,4);
      uVar9 = uVar9 + 0x10;
      auVar12 = vpaddq_avx512f(auVar12,auVar16);
      auVar20 = vporq_avx512f(auVar18,auVar14);
      auVar18 = vporq_avx512f(auVar18,auVar15);
      uVar3 = vpcmpuq_avx512f(auVar20,auVar17,2);
      uVar4 = vpcmpuq_avx512f(auVar18,auVar17,2);
      auVar18 = vpsllq_avx512f(auVar13,4);
      auVar13 = vpaddq_avx512f(auVar13,auVar16);
      vpscatterqd_avx512f(ZEXT832(piVar7) + auVar19._0_32_,uVar3,
                          SUB6432(ZEXT1664((undefined1  [16])0x0),0));
      vpscatterqd_avx512f(ZEXT832(piVar7) + auVar18._0_32_,uVar4,
                          SUB6432(ZEXT1664((undefined1  [16])0x0),0));
    } while (((iVar10 - lVar11) + 0xfU & 0xfffffffffffffff0) != uVar9);
    endIndex = (primitive_boxes->super_cbtAlignedObjectArray<GIM_BVH_DATA>).m_size;
  }
  (this->m_node_array).super_cbtAlignedObjectArray<BT_QUANTIZED_BVH_NODE>.m_size = iVar10;
  _build_sub_tree(this,primitive_boxes,0,endIndex);
  return;
}

Assistant:

void cbtQuantizedBvhTree::build_tree(
	GIM_BVH_DATA_ARRAY& primitive_boxes)
{
	calc_quantization(primitive_boxes);
	// initialize node count to 0
	m_num_nodes = 0;
	// allocate nodes
	m_node_array.resize(primitive_boxes.size() * 2);

	_build_sub_tree(primitive_boxes, 0, primitive_boxes.size());
}